

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipcdial.c
# Opt level: O3

void nni_posix_ipc_dialer_cb(void *arg,uint ev)

{
  nni_aio *aio;
  int iVar1;
  nng_err *pnVar2;
  nni_mtx *mtx;
  socklen_t local_30;
  nng_err local_2c;
  socklen_t sz;
  int rv;
  
  mtx = (nni_mtx *)(*(long *)((long)arg + 0xd8) + 0x60);
  nni_mtx_lock(mtx);
  aio = *(nni_aio **)((long)arg + 0xd0);
  if ((aio != (nni_aio *)0x0) && (iVar1 = nni_aio_list_active(aio), iVar1 != 0)) {
    if ((ev & 0x20) == 0) {
      local_30 = 4;
      iVar1 = nni_posix_pfd_fd((nni_posix_pfd *)((long)arg + 0x38));
      iVar1 = getsockopt(iVar1,1,4,&local_2c,&local_30);
      if (iVar1 < 0) {
        pnVar2 = (nng_err *)__errno_location();
        local_2c = *pnVar2;
      }
      if (local_2c != NNG_OK) {
        if (local_2c == 0x73) {
          nni_mtx_unlock(mtx);
          return;
        }
        local_2c = nni_plat_errno(local_2c);
      }
    }
    else {
      local_2c = NNG_ENOTSUP;
    }
    *(undefined8 *)((long)arg + 0xd0) = 0;
    nni_aio_list_remove(aio);
    nni_aio_set_prov_data(aio,(void *)0x0);
    nni_mtx_unlock(mtx);
    if (local_2c == NNG_OK) {
      nni_aio_set_output(aio,0,arg);
      nni_aio_finish(aio,NNG_OK,0);
    }
    else {
      nng_stream_close((nng_stream *)arg);
      nng_stream_stop((nng_stream *)arg);
      nng_stream_free((nng_stream *)arg);
      nni_aio_finish_error(aio,local_2c);
    }
    return;
  }
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

void
nni_posix_ipc_dialer_cb(void *arg, unsigned ev)
{
	nni_ipc_conn   *c = arg;
	nni_ipc_dialer *d = c->dialer;
	nni_aio        *aio;
	int             rv;

	nni_mtx_lock(&d->mtx);
	aio = c->dial_aio;
	if ((aio == NULL) || (!nni_aio_list_active(aio))) {
		nni_mtx_unlock(&d->mtx);
		return;
	}

	if ((ev & NNI_POLL_INVAL) != 0) {
		rv = EBADF;

	} else {
		socklen_t sz = sizeof(int);
		int       fd = nni_posix_pfd_fd(&c->pfd);
		if (getsockopt(fd, SOL_SOCKET, SO_ERROR, &rv, &sz) < 0) {
			rv = errno;
		}
		if (rv == EINPROGRESS) {
			// Connection still in progress, come back
			// later.
			nni_mtx_unlock(&d->mtx);
			return;
		} else if (rv != 0) {
			rv = nni_plat_errno(rv);
		}
	}

	c->dial_aio = NULL;
	nni_aio_list_remove(aio);
	nni_aio_set_prov_data(aio, NULL);
	nni_mtx_unlock(&d->mtx);

	if (rv != 0) {
		nng_stream_close(&c->stream);
		nng_stream_stop(&c->stream);
		nng_stream_free(&c->stream);
		nni_aio_finish_error(aio, rv);
		return;
	}

	nni_aio_set_output(aio, 0, c);
	nni_aio_finish(aio, 0, 0);
}